

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_patchclose(FuncState *fs,int list,int level)

{
  Instruction *pIVar1;
  long lVar2;
  uint uVar3;
  
  while( true ) {
    if (list == -1) {
      return;
    }
    pIVar1 = fs->f->code;
    lVar2 = (long)list;
    uVar3 = pIVar1[lVar2];
    if (((char)uVar3 != '\x1e') || (uVar3 = uVar3 >> 8 & 0x7f, (int)uVar3 <= level && uVar3 != 0))
    break;
    *(byte *)((long)pIVar1 + lVar2 * 4 + 1) = (byte)(level + 1U) & 0x7f;
    if (((byte)ravi_parser_debug & 2) != 0) {
      raviY_printf(fs,"[?]* %o ; set A to %d\n",(ulong)fs->f->code[lVar2],(ulong)(level + 1U));
    }
    list = getjump(fs,list);
  }
  __assert_fail("((OpCode)(((fs->f->code[list])&0xff))) == OP_JMP && (((int)(((fs->f->code[list])>>8)&0x7f)) == 0 || ((int)(((fs->f->code[list])>>8)&0x7f)) >= level)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x125,"void luaK_patchclose(FuncState *, int, int)");
}

Assistant:

void luaK_patchclose (FuncState *fs, int list, int level) {
  level++;  /* argument is +1 to reserve 0 as non-op */
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    lua_assert(GET_OPCODE(fs->f->code[list]) == OP_JMP &&
                (GETARG_A(fs->f->code[list]) == 0 ||
                 GETARG_A(fs->f->code[list]) >= level));
    SETARG_A(fs->f->code[list], level);
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; set A to %d\n", fs->f->code[list], level));
  }
}